

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
ExplicitProducer::dequeue<unsigned_int>(ExplicitProducer *this,uint *element)

{
  ulong uVar1;
  unsigned_long b;
  ulong uVar2;
  __int_type_conflict _Var3;
  Block *this_00;
  bool bVar4;
  atomic<unsigned_long> *paVar5;
  __pointer_type pBVar6;
  uint *puVar7;
  uint *el;
  Block *block;
  size_t offset;
  unsigned_long blockBaseIndex;
  index_t headBase;
  __int_type_conflict localBlockIndexHead;
  __pointer_type localBlockIndex;
  __int_type_conflict index;
  __int_type_conflict myDequeueCount;
  __int_type_conflict overcommit;
  __int_type_conflict tail;
  uint *element_local;
  ExplicitProducer *this_local;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  b = (this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar2 = (this->super_ProducerBase).dequeueOvercommit.super___atomic_base<unsigned_long>._M_i;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  bVar4 = details::circular_less_than<unsigned_long>
                    ((this->super_ProducerBase).dequeueOptimisticCount.
                     super___atomic_base<unsigned_long>._M_i - uVar2,b);
  if (bVar4) {
    paVar5 = &(this->super_ProducerBase).dequeueOptimisticCount;
    LOCK();
    uVar1 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
    (paVar5->super___atomic_base<unsigned_long>)._M_i =
         (paVar5->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (uVar1 < uVar2) {
      __assert_fail("overcommit <= myDequeueCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                    ,0x76f,
                    "bool moodycamel::ConcurrentQueue<unsigned int>::ExplicitProducer::dequeue(U &) [T = unsigned int, Traits = moodycamel::ConcurrentQueueDefaultTraits, U = unsigned int]"
                   );
    }
    std::operator&(memory_order_acquire,__memory_order_mask);
    bVar4 = details::circular_less_than<unsigned_long>
                      (uVar1 - uVar2,
                       (this->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i)
    ;
    bVar4 = details::likely(bVar4);
    if (bVar4) {
      paVar5 = &(this->super_ProducerBase).headIndex;
      LOCK();
      uVar2 = (paVar5->super___atomic_base<unsigned_long>)._M_i;
      (paVar5->super___atomic_base<unsigned_long>)._M_i =
           (paVar5->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      pBVar6 = std::
               atomic<moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::ExplicitProducer::BlockIndexHeader_*>
               ::load(&this->blockIndex,memory_order_acquire);
      std::operator&(memory_order_acquire,__memory_order_mask);
      _Var3 = (pBVar6->front).super___atomic_base<unsigned_long>._M_i;
      this_00 = pBVar6->entries
                [_Var3 + ((uVar2 & 0xffffffffffffffe0) - pBVar6->entries[_Var3].base >> 5) &
                 pBVar6->size - 1].block;
      puVar7 = Block::operator[](this_00,uVar2);
      *element = *puVar7;
      ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::Block::
      set_empty<(moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
                ((Block *)this_00,uVar2);
      return true;
    }
    paVar5 = &(this->super_ProducerBase).dequeueOvercommit;
    LOCK();
    (paVar5->super___atomic_base<unsigned_long>)._M_i =
         (paVar5->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
  }
  return false;
}

Assistant:

bool dequeue(U& element)
		{
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto overcommit = this->dequeueOvercommit.load(std::memory_order_relaxed);
			if (details::circular_less_than<index_t>(this->dequeueOptimisticCount.load(std::memory_order_relaxed) - overcommit, tail)) {
				// Might be something to dequeue, let's give it a try
				
				// Note that this if is purely for performance purposes in the common case when the queue is
				// empty and the values are eventually consistent -- we may enter here spuriously.
				
				// Note that whatever the values of overcommit and tail are, they are not going to change (unless we
				// change them) and must be the same value at this point (inside the if) as when the if condition was
				// evaluated.

				// We insert an acquire fence here to synchronize-with the release upon incrementing dequeueOvercommit below.
				// This ensures that whatever the value we got loaded into overcommit, the load of dequeueOptisticCount in
				// the fetch_add below will result in a value at least as recent as that (and therefore at least as large).
				// Note that I believe a compiler (signal) fence here would be sufficient due to the nature of fetch_add (all
				// read-modify-write operations are guaranteed to work on the latest value in the modification order), but
				// unfortunately that can't be shown to be correct using only the C++11 standard.
				// See http://stackoverflow.com/questions/18223161/what-are-the-c11-memory-ordering-guarantees-in-this-corner-case
				std::atomic_thread_fence(std::memory_order_acquire);
				
				// Increment optimistic counter, then check if it went over the boundary
				auto myDequeueCount = this->dequeueOptimisticCount.fetch_add(1, std::memory_order_relaxed);
				
				// Note that since dequeueOvercommit must be <= dequeueOptimisticCount (because dequeueOvercommit is only ever
				// incremented after dequeueOptimisticCount -- this is enforced in the `else` block below), and since we now
				// have a version of dequeueOptimisticCount that is at least as recent as overcommit (due to the release upon
				// incrementing dequeueOvercommit and the acquire above that synchronizes with it), overcommit <= myDequeueCount.
				assert(overcommit <= myDequeueCount);
				
				// Note that we reload tail here in case it changed; it will be the same value as before or greater, since
				// this load is sequenced after (happens after) the earlier load above. This is supported by read-read
				// coherency (as defined in the standard), explained here: http://en.cppreference.com/w/cpp/atomic/memory_order
				tail = this->tailIndex.load(std::memory_order_acquire);
				if (details::likely(details::circular_less_than<index_t>(myDequeueCount - overcommit, tail))) {
					// Guaranteed to be at least one element to dequeue!
					
					// Get the index. Note that since there's guaranteed to be at least one element, this
					// will never exceed tail. We need to do an acquire-release fence here since it's possible
					// that whatever condition got us to this point was for an earlier enqueued element (that
					// we already see the memory effects for), but that by the time we increment somebody else
					// has incremented it, and we need to see the memory effects for *that* element, which is
					// in such a case is necessarily visible on the thread that incremented it in the first
					// place with the more current condition (they must have acquired a tail that is at least
					// as recent).
					auto index = this->headIndex.fetch_add(1, std::memory_order_acq_rel);
					
					
					// Determine which block the element is in
					
					auto localBlockIndex = blockIndex.load(std::memory_order_acquire);
					auto localBlockIndexHead = localBlockIndex->front.load(std::memory_order_acquire);
					
					// We need to be careful here about subtracting and dividing because of index wrap-around.
					// When an index wraps, we need to preserve the sign of the offset when dividing it by the
					// block size (in order to get a correct signed block count offset in all cases):
					auto headBase = localBlockIndex->entries[localBlockIndexHead].base;
					auto blockBaseIndex = index & ~static_cast<index_t>(BLOCK_SIZE - 1);
					auto offset = static_cast<size_t>(static_cast<typename std::make_signed<index_t>::type>(blockBaseIndex - headBase) / BLOCK_SIZE);
					auto block = localBlockIndex->entries[(localBlockIndexHead + offset) & (localBlockIndex->size - 1)].block;
					
					// Dequeue
					auto& el = *((*block)[index]);
					if (!MOODYCAMEL_NOEXCEPT_ASSIGN(T, T&&, element = std::move(el))) {
						// Make sure the element is still fully dequeued and destroyed even if the assignment
						// throws
						struct Guard {
							Block* block;
							index_t index;
							
							~Guard()
							{
								(*block)[index]->~T();
								block->ConcurrentQueue::Block::template set_empty<explicit_context>(index);
							}
						} guard = { block, index };
						
						element = std::move(el);
					}
					else {
						element = std::move(el);
						el.~T();
						block->ConcurrentQueue::Block::template set_empty<explicit_context>(index);
					}
					
					return true;
				}
				else {
					// Wasn't anything to dequeue after all; make the effective dequeue count eventually consistent
					this->dequeueOvercommit.fetch_add(1, std::memory_order_release);		// Release so that the fetch_add on dequeueOptimisticCount is guaranteed to happen before this write
				}
			}
		
			return false;
		}